

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O3

bool CoreML::Specification::operator==
               (KNearestNeighborsClassifier *a,KNearestNeighborsClassifier *b)

{
  int iVar1;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  long *plVar7;
  undefined1 *puVar8;
  int iVar9;
  undefined1 *puVar10;
  long lVar11;
  NearestNeighborsIndex aIndex;
  NearestNeighborsIndex bIndex;
  NearestNeighborsIndex local_d0;
  NearestNeighborsIndex local_80;
  
  puVar10 = (undefined1 *)a->nearestneighborsindex_;
  if ((NearestNeighborsIndex *)puVar10 == (NearestNeighborsIndex *)0x0) {
    puVar10 = _NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_d0,(NearestNeighborsIndex *)puVar10);
  puVar10 = (undefined1 *)b->nearestneighborsindex_;
  if ((NearestNeighborsIndex *)puVar10 == (NearestNeighborsIndex *)0x0) {
    puVar10 = _NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_80,(NearestNeighborsIndex *)puVar10);
  if ((local_d0.numberofdimensions_ == local_80.numberofdimensions_) &&
     (local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_ ==
      local_80.floatsamples_.super_RepeatedPtrFieldBase.current_size_)) {
    if (0 < local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_) {
      iVar9 = 0;
      do {
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,iVar9);
        iVar1 = (pTVar5->vector_).current_size_;
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_80.floatsamples_.super_RepeatedPtrFieldBase,iVar9);
        if (iVar1 != (pTVar5->vector_).current_size_) goto LAB_0032a46b;
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,iVar9);
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_80.floatsamples_.super_RepeatedPtrFieldBase,iVar9);
        bVar4 = operator==(&pTVar5->vector_,&pTVar6->vector_);
        if (!bVar4) goto LAB_0032a46b;
        iVar9 = iVar9 + 1;
      } while (iVar9 < local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_);
    }
    if ((local_d0._oneof_case_[0] == local_80._oneof_case_[0]) &&
       (local_d0._oneof_case_[1] == local_80._oneof_case_[1])) {
      puVar10 = (undefined1 *)a->numberofneighbors_;
      if ((Int64Parameter *)puVar10 == (Int64Parameter *)0x0) {
        puVar10 = _Int64Parameter_default_instance_;
      }
      puVar8 = (undefined1 *)b->numberofneighbors_;
      if ((Int64Parameter *)puVar8 == (Int64Parameter *)0x0) {
        puVar8 = _Int64Parameter_default_instance_;
      }
      if ((((Int64Parameter *)puVar10)->defaultvalue_ == ((Int64Parameter *)puVar8)->defaultvalue_)
         && (uVar2 = ((Int64Parameter *)puVar10)->_oneof_case_[0],
            uVar2 == ((Int64Parameter *)puVar8)->_oneof_case_[0])) {
        if (uVar2 == 0xb) {
          iVar9 = (((((Int64Parameter *)puVar10)->AllowedValues_).set_)->values_).current_size_;
          if (iVar9 != (((((Int64Parameter *)puVar8)->AllowedValues_).set_)->values_).current_size_)
          goto LAB_0032a46b;
          if (0 < iVar9) {
            lVar11 = 0;
            do {
              puVar10 = (undefined1 *)a->numberofneighbors_;
              if ((Int64Parameter *)puVar10 == (Int64Parameter *)0x0) {
                puVar10 = _Int64Parameter_default_instance_;
              }
              puVar8 = _Int64Set_default_instance_;
              if (((Int64Parameter *)puVar10)->_oneof_case_[0] == 0xb) {
                puVar8 = (undefined1 *)(((Int64Parameter *)puVar10)->AllowedValues_).set_;
              }
              plVar7 = google::protobuf::RepeatedField<long>::Get
                                 (&((Int64Set *)puVar8)->values_,(int)lVar11);
              puVar10 = (undefined1 *)b->numberofneighbors_;
              if ((Int64Parameter *)puVar10 == (Int64Parameter *)0x0) {
                puVar10 = _Int64Parameter_default_instance_;
              }
              puVar8 = _Int64Set_default_instance_;
              if (((Int64Parameter *)puVar10)->_oneof_case_[0] == 0xb) {
                puVar8 = (undefined1 *)(((Int64Parameter *)puVar10)->AllowedValues_).set_;
              }
              lVar3 = *plVar7;
              plVar7 = google::protobuf::RepeatedField<long>::Get
                                 (&((Int64Set *)puVar8)->values_,(int)lVar11);
              if (lVar3 != *plVar7) goto LAB_0032a46b;
              lVar11 = lVar11 + 1;
            } while (iVar9 != lVar11);
          }
        }
        else if (uVar2 == 10) {
          if ((((((Int64Parameter *)puVar10)->AllowedValues_).range_)->minvalue_ !=
               ((((Int64Parameter *)puVar8)->AllowedValues_).range_)->minvalue_) ||
             (((((Int64Parameter *)puVar10)->AllowedValues_).range_)->maxvalue_ !=
              ((((Int64Parameter *)puVar8)->AllowedValues_).range_)->maxvalue_)) goto LAB_0032a46b;
        }
        uVar2 = a->_oneof_case_[0];
        if (uVar2 == b->_oneof_case_[0]) {
          if (uVar2 == 0) {
            bVar4 = true;
            goto LAB_0032a46d;
          }
          if (uVar2 == 100) {
            bVar4 = vectorsEqual<CoreML::Specification::StringVector>
                              ((a->ClassLabels_).stringclasslabels_,
                               (b->ClassLabels_).stringclasslabels_);
            goto LAB_0032a46d;
          }
          if (uVar2 == 0x65) {
            bVar4 = vectorsEqual<CoreML::Specification::Int64Vector>
                              ((a->ClassLabels_).int64classlabels_,
                               (b->ClassLabels_).int64classlabels_);
            goto LAB_0032a46d;
          }
        }
      }
    }
  }
LAB_0032a46b:
  bVar4 = false;
LAB_0032a46d:
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_80);
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_d0);
  return bVar4;
}

Assistant:

bool operator==(const KNearestNeighborsClassifier& a,
                        const KNearestNeighborsClassifier& b) {
            auto aIndex = a.nearestneighborsindex();
            auto bIndex = b.nearestneighborsindex();
            if (aIndex.numberofdimensions() != bIndex.numberofdimensions()) {
                return false;
            }
            if (aIndex.floatsamples_size() != bIndex.floatsamples_size()) {
                return false;
            }
            for (int i = 0; i < aIndex.floatsamples_size(); i++) {
                if (aIndex.floatsamples(i).vector_size() != bIndex.floatsamples(i).vector_size()) {
                    return false;
                }
                if (aIndex.floatsamples(i).vector() != bIndex.floatsamples(i).vector()) {
                    return false;
                }
            }
            if (aIndex.IndexType_case() != bIndex.IndexType_case()) {
                return false;
            }
            if (aIndex.DistanceFunction_case() != bIndex.DistanceFunction_case()) {
                return false;
            }
            if (a.numberofneighbors().defaultvalue() != b.numberofneighbors().defaultvalue()) {
                return false;
            }
            if (a.numberofneighbors().AllowedValues_case() != b.numberofneighbors().AllowedValues_case()) {
                return false;
            }
            switch (a.numberofneighbors().AllowedValues_case()) {
                case Specification::Int64Parameter::AllowedValuesCase::kRange:
                {
                    if (a.numberofneighbors().range().minvalue() != b.numberofneighbors().range().minvalue() || a.numberofneighbors().range().maxvalue() != b.numberofneighbors().range().maxvalue()) {
                        return false;
                    }
                    break;
                }
                case Specification::Int64Parameter::AllowedValuesCase::kSet:
                {
                    if (a.numberofneighbors().set().values_size() != b.numberofneighbors().set().values_size()) {
                        return false;
                    }
                    int64_t count = a.numberofneighbors().set().values_size();
                    for (int64_t i = 0; i < count; i++) {
                        if (a.numberofneighbors().set().values((int)i) != b.numberofneighbors().set().values((int)i)) {
                            return false;
                        }
                    } // for i in set
                    break;
                } // case kSet
                case Specification::Int64Parameter::AllowedValuesCase::ALLOWEDVALUES_NOT_SET:
                    break;
            } // switch AllowedValuesCase
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case KNearestNeighborsClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case KNearestNeighborsClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case KNearestNeighborsClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            if (a.WeightingScheme_case() != b.WeightingScheme_case()) {
                return false;
            }
        }